

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time.cc
# Opt level: O3

ostream * __thiscall
absl::lts_20240722::time_internal::operator<<(time_internal *this,ostream *os,CivilYear y)

{
  ostream *poVar1;
  undefined8 in_R9;
  string_view fmt;
  CivilSecond cs;
  string local_30;
  
  cs.f_.y = y.f_.y & 0xffffffffff;
  fmt._M_str = (char *)os;
  fmt._M_len = (size_t)"";
  cs.f_._8_8_ = in_R9;
  (anonymous_namespace)::FormatYearAnd_abi_cxx11_(&local_30,(_anonymous_namespace_ *)0x0,fmt,cs);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, CivilYear y) {
  return os << FormatCivilTime(y);
}